

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  LogMessage *other;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint8 *puVar10;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar9 = field_number * 8 + 3;
  uVar4 = (ulong)uVar9;
  uVar8 = field_number << 3;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar9);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar6 = pbVar1;
    if (0x7f < uVar8) {
      do {
        uVar9 = (uint)uVar4;
        *pbVar6 = (byte)uVar4 | 0x80;
        uVar4 = uVar4 >> 7;
        pbVar6 = pbVar6 + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar6 = (byte)uVar4;
    iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar5;
    output->buffer_size_ = output->buffer_size_ - iVar5;
  }
  iVar5 = (*value->_vptr_MessageLite[0xf])(value);
  if (output->buffer_size_ < iVar5) {
    puVar10 = (uint8 *)0x0;
  }
  else {
    puVar10 = output->buffer_;
    output->buffer_ = puVar10 + iVar5;
    output->buffer_size_ = output->buffer_size_ - iVar5;
  }
  if (puVar10 == (uint8 *)0x0) {
    (*value->_vptr_MessageLite[0xd])(value,output);
  }
  else {
    uVar4 = io::CodedOutputStream::default_serialization_deterministic_;
    if (output->serialization_deterministic_is_overridden_ != false) {
      uVar4 = (ulong)output->serialization_deterministic_override_;
    }
    iVar3 = (*value->_vptr_MessageLite[0x10])(value,(ulong)(uVar4 != 0),puVar10);
    if (CONCAT44(extraout_var,iVar3) - (long)puVar10 != (long)iVar5) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
                 ,0x236);
      other = LogMessage::operator<<(&local_60,"CHECK failed: (end - target) == (size): ");
      LogFinisher::operator=(&local_61,other);
      LogMessage::~LogMessage(&local_60);
    }
  }
  uVar9 = uVar8 | 4;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar9);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar6 = pbVar1;
    uVar7 = uVar9;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar7 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar9;
        uVar9 = uVar7;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar7;
    iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar5;
    output->buffer_size_ = output->buffer_size_ - iVar5;
  }
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.InternalSerializeWithCachedSizesToArray(
        output->IsSerializationDeterministic(), target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}